

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelInstance.cpp
# Opt level: O0

void __thiscall ModelInstance::ModelInstance(ModelInstance *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  byte bVar6;
  undefined8 auStack_3f48 [668];
  undefined4 local_2a68;
  float local_2a60;
  float fStack_2a5c;
  float fStack_2a58;
  float fStack_2a54;
  float local_2a50;
  undefined8 *local_2a40;
  array<std::vector<float,_std::allocator<float>_>,_2UL> *local_2a38;
  vector<float,_std::allocator<float>_> *local_2a30;
  ModelInstance *local_2a28;
  vector<int,_std::allocator<int>_> *local_2a20;
  undefined1 local_2a18 [12];
  float fStack_2a0c;
  float local_2a08;
  undefined8 local_2a00 [668];
  undefined4 local_1520;
  undefined1 auStack_1518 [8];
  ParameterObj myPars;
  undefined1 local_14f4 [8];
  NetworkArray myNet;
  ModelInstance *this_local;
  
  bVar6 = 0;
  local_2a28 = this;
  myNet._5340_8_ = this;
  NetworkArray::NetworkArray(&this->network);
  local_2a38 = &local_2a28->dimersactive;
  std::array<std::vector<float,_std::allocator<float>_>,_2UL>::array(local_2a38);
  local_2a30 = &local_2a28->homotetramer;
  std::vector<float,_std::allocator<float>_>::vector(local_2a30);
  local_2a20 = &local_2a28->states;
  std::vector<int,_std::allocator<int>_>::vector(local_2a20);
  NetworkArray::NetworkArray((NetworkArray *)local_14f4);
  ParameterObj::ParameterObj((ParameterObj *)auStack_1518);
  local_2a40 = local_2a00;
  memcpy(local_2a40,local_14f4,0x14e4);
  local_2a08 = myPars.H_conc;
  local_2a18._0_8_ = auStack_1518;
  uVar1 = local_2a18._0_8_;
  local_2a18._8_4_ = myPars.S_conc;
  fStack_2a0c = myPars.L_conc;
  uVar2 = stack0xffffffffffffd5f0;
  puVar4 = local_2a40;
  puVar5 = auStack_3f48;
  for (lVar3 = 0x29c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  local_2a68 = local_1520;
  local_2a50 = myPars.H_conc;
  local_2a18._0_4_ = auStack_1518._0_4_;
  local_2a18._4_4_ = auStack_1518._4_4_;
  local_2a18._8_4_ = myPars.S_conc;
  fStack_2a0c = myPars.L_conc;
  local_2a60 = (float)local_2a18._0_4_;
  fStack_2a5c = (float)local_2a18._4_4_;
  fStack_2a58 = (float)local_2a18._8_4_;
  fStack_2a54 = fStack_2a0c;
  local_2a18._0_8_ = uVar1;
  unique0x10000221 = uVar2;
  assign(local_2a28);
  return;
}

Assistant:

ModelInstance::ModelInstance() {
	NetworkArray myNet;
	ParameterObj myPars;
	assign(myNet, myPars);
}